

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd.c
# Opt level: O1

void sfd_listener_close(void *arg)

{
  nni_aio *aio;
  long lVar1;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0xb0));
  *(undefined1 *)((long)arg + 0x94) = 1;
  aio = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x98));
  while (aio != (nni_aio *)0x0) {
    nni_aio_list_remove(aio);
    nni_aio_finish_error(aio,NNG_ECLOSED);
    aio = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x98));
  }
  if (0 < *(int *)((long)arg + 0x50)) {
    lVar1 = 0;
    do {
      nni_sfd_close_fd(*(int *)((long)arg + lVar1 * 4 + 0x54));
      lVar1 = lVar1 + 1;
    } while (lVar1 < *(int *)((long)arg + 0x50));
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 0xb0));
  return;
}

Assistant:

static void
sfd_listener_close(void *arg)
{
	nni_aio      *aio;
	sfd_listener *l = arg;
	nni_mtx_lock(&l->mtx);
	l->closed = true;
	while ((aio = nni_list_first(&l->accept_q)) != NULL) {
		nni_aio_list_remove(aio);
		nni_aio_finish_error(aio, NNG_ECLOSED);
	}
	for (int i = 0; i < l->listen_cnt; i++) {
		nni_sfd_close_fd(l->listen_q[i]);
	}
	nni_mtx_unlock(&l->mtx);
}